

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::getQuadratureWeights
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *weights)

{
  int iVar1;
  vector<double,_std::allocator<double>_> *weights_local;
  TasmanianSparseGrid *this_local;
  
  iVar1 = getNumPoints(this);
  std::vector<double,_std::allocator<double>_>::resize(weights,(long)iVar1);
  std::vector<double,_std::allocator<double>_>::data(weights);
  TasGrid::TasmanianSparseGrid::getQuadratureWeights((double *)this);
  return;
}

Assistant:

void getQuadratureWeights(std::vector<double> &weights) const{ weights.resize((size_t) getNumPoints()); getQuadratureWeights(weights.data()); }